

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

int __thiscall
OpenMD::SelectionEvaluator::select
          (SelectionEvaluator *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  int extraout_EAX;
  int in_stack_0000023c;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *in_stack_00000240;
  SelectionEvaluator *in_stack_00000248;
  SelectionSet *in_stack_ffffffffffffffd8;
  SelectionSet *in_stack_ffffffffffffffe0;
  
  expression(in_stack_00000248,in_stack_00000240,in_stack_0000023c);
  SelectionSet::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SelectionSet::~SelectionSet((SelectionSet *)0x3c0fbf);
  return extraout_EAX;
}

Assistant:

void SelectionEvaluator::select(SelectionSet& bs) {
    bs = expression(statement, 1);
  }